

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memfs_malloc.cc
# Opt level: O0

void __thiscall
HugetlbSysAllocator::HugetlbSysAllocator(HugetlbSysAllocator *this,SysAllocator *fallback)

{
  SysAllocator *fallback_local;
  HugetlbSysAllocator *this_local;
  
  SysAllocator::SysAllocator(&this->super_SysAllocator);
  (this->super_SysAllocator)._vptr_SysAllocator = (_func_int **)&PTR__HugetlbSysAllocator_001b8a28;
  this->failed_ = true;
  this->big_page_size_ = 0;
  this->hugetlb_fd_ = -1;
  this->hugetlb_base_ = 0;
  this->fallback_ = fallback;
  return;
}

Assistant:

explicit HugetlbSysAllocator(SysAllocator* fallback)
    : failed_(true),  // To disable allocator until Initialize() is called.
      big_page_size_(0),
      hugetlb_fd_(-1),
      hugetlb_base_(0),
      fallback_(fallback) {
  }